

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota_lessor.c
# Opt level: O2

int main(void)

{
  int iVar1;
  ssize_t sVar2;
  undefined1 local_50 [8];
  quota_lessor l;
  quota q;
  
  plan(3);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  test_basic();
  test_hard_lease();
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_leases_on_destroy");
  l.leased = 0xffffffff00000000;
  quota_lessor_create((quota_lessor *)local_50,(quota *)&l.leased);
  sVar2 = quota_lease((quota_lessor *)local_50,100);
  _ok((uint)(sVar2 == 100),"quota_lease(&l, 100) == 100",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6c
      ,"line %d",0x6c);
  quota_lessor_destroy((quota_lessor *)local_50);
  _ok((uint)(l.used == 0),"quota_leased(&l) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6e
      ,"line %d",0x6e);
  _ok((uint)(l.source == (quota *)l.used),"quota_available(&l) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6f
      ,"line %d",0x6f);
  _ok((uint)((int)l.leased == 0),"quota_used(&q) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x70
      ,"line %d",0x70);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_leases_on_destroy");
  check_plan();
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main()
{
	plan(3);
	header();

	test_basic();
	test_hard_lease();
	test_leases_on_destroy();

	footer();
	return check_plan();
}